

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::DoByteCodeUpwardExposedUsed(BackwardPass *this)

{
  bool bVar1;
  BOOL BVar2;
  bool local_19;
  BackwardPass *this_local;
  
  if ((this->tag != DeadStorePhase) ||
     (local_19 = true, (*(uint *)&this->func->field_0x240 >> 4 & 1) == 0)) {
    if ((this->tag == BackwardPhase) &&
       ((BVar2 = Func::HasTry(this->func), BVar2 != 0 &&
        (bVar1 = Func::DoOptimizeTry(this->func), bVar1)))) {
      return true;
    }
    local_19 = this->tag == CaptureByteCodeRegUsePhase;
  }
  return local_19;
}

Assistant:

bool
BackwardPass::DoByteCodeUpwardExposedUsed() const
{
    return (
        (this->tag == Js::DeadStorePhase && this->func->hasBailout) ||
        (this->tag == Js::BackwardPhase && this->func->HasTry() && this->func->DoOptimizeTry())
#if DBG
        || tag == Js::CaptureByteCodeRegUsePhase
#endif
    );
}